

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CZ.cpp
# Opt level: O2

void __thiscall
qclab::qgates::CZ<float>::apply
          (CZ<float> *this,Op op,int nbQubits,vector<float,_std::allocator<float>_> *vector,
          int offset)

{
  int iVar1;
  int iVar2;
  vector<int,_std::allocator<int>_> qubits;
  anon_class_8_1_703dd281 f;
  _Vector_base<int,_std::allocator<int>_> local_48;
  anon_class_8_1_703dd281 local_30;
  
  (*(this->super_QControlledGate2<float>).super_QGate2<float>.super_QObject<float>._vptr_QObject[5])
            (&local_48,this);
  *(ulong *)local_48._M_impl.super__Vector_impl_data._M_start =
       CONCAT44(offset + (int)((ulong)*(undefined8 *)
                                       local_48._M_impl.super__Vector_impl_data._M_start >> 0x20),
                offset + (int)*(undefined8 *)local_48._M_impl.super__Vector_impl_data._M_start);
  iVar1 = (this->super_QControlledGate2<float>).control_;
  iVar2 = (*(this->super_QControlledGate2<float>).super_QGate2<float>.super_QObject<float>.
            _vptr_QObject[0xf])(this);
  local_30.vector =
       (vector->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  apply4b<qclab::qgates::lambda_PauliZ<float>(qclab::Op,float*)::_lambda(unsigned_long)_1_>
            (nbQubits,*local_48._M_impl.super__Vector_impl_data._M_start,
             local_48._M_impl.super__Vector_impl_data._M_start[1],iVar1 + offset,iVar2 + offset,
             (this->super_QControlledGate2<float>).controlState_,&local_30);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void CZ< T >::apply( Op op , const int nbQubits , std::vector< T >& vector ,
                       const int offset ) const {
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    const int control = this->control() + offset ;
    const int target  = this->target()  + offset ;
    auto f = lambda_PauliZ( op , vector.data() ) ;
    apply4b( nbQubits , qubits[0] , qubits[1] , control , target ,
             this->controlState() , f ) ;
  }